

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O2

_Bool PPC_alias_insn(char *name,ppc_alias *alias)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  lVar1 = -0x10;
  do {
    lVar5 = lVar1;
    if (lVar5 + 0x10 == 0x500) {
      iVar3 = name2id(insn_name_maps + 1,0x3a5,name);
      iVar2 = 0;
      if (iVar3 == -1) goto LAB_0019ca24;
      uVar4 = insn_name_maps[iVar3].id;
      goto LAB_0019ca1d;
    }
    iVar2 = strcmp(name,*(char **)((long)&alias_insn_name_maps[1].mnem + lVar5));
    lVar1 = lVar5 + 0x10;
  } while (iVar2 != 0);
  uVar4 = *(uint *)((long)&alias_insn_name_maps[1].id + lVar5);
  iVar2 = *(int *)((long)&alias_insn_name_maps[1].cc + lVar5);
LAB_0019ca1d:
  alias->id = uVar4;
  alias->cc = iVar2;
  iVar2 = 1;
LAB_0019ca24:
  return SUB41(iVar2,0);
}

Assistant:

bool PPC_alias_insn(const char *name, struct ppc_alias *alias)
{
	size_t i;
#ifndef CAPSTONE_DIET
	int x;
#endif

	for(i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (!strcmp(name, alias_insn_name_maps[i].mnem)) {
			alias->id = alias_insn_name_maps[i].id;
			alias->cc = alias_insn_name_maps[i].cc;
			return true;
		}
	}

#ifndef CAPSTONE_DIET
	// not really an alias insn
	x = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);
	if (x != -1) {
		alias->id = insn_name_maps[x].id;
		alias->cc = PPC_BC_INVALID;
		return true;
	}
#endif

	// not found
	return false;
}